

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::map_into<long>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  Alloc *pAVar1;
  int iVar2;
  ulong uVar3;
  LO n;
  size_t sVar4;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_c9;
  type f;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_c9);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x1b);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_50,
                 &local_90);
  begin_code("map_into",(char *)f.a2b.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  n = (LO)(sVar4 >> 2);
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size >> 3;
    iVar2 = n * width;
    if (iVar2 == (int)uVar3) goto LAB_002b7a9c;
  }
  else {
    iVar2 = (int)((ulong)pAVar1 >> 6);
    if (n * width == iVar2) goto LAB_002b7a9c;
    uVar3 = (ulong)pAVar1 >> 6 & 0xffffffff;
  }
  iVar2 = n * width;
  printf("ERROR: a_data.size= %d na= %d width= %d\n",uVar3,sVar4 >> 2 & 0xffffffff,
         (ulong)(uint)width);
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
LAB_002b7a9c:
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  if (iVar2 != (int)(uVar3 >> 3)) {
    fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
         ,0x1d);
  }
  Write<int>::Write((Write<int> *)&f,&a2b->write_);
  f.width = width;
  Write<long>::Write((Write<int> *)&f.b_data,(Write<int> *)b_data);
  Write<long>::Write((Write<int> *)&f.a_data,(Write<int> *)a_data);
  parallel_for<Omega_h::map_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::_lambda(int)_1_>
            (n,&f);
  map_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::{lambda(int)#1}::
  ~Write((_lambda_int__1_ *)&f);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void map_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size();
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] = a_data[a * width + j];
    }
  };
  parallel_for(na, std::move(f));
}